

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReader::reparse(QCborStreamReader *this)

{
  long lVar1;
  CborError CVar2;
  pointer pQVar3;
  CborValue *in_RDI;
  long in_FS_OFFSET;
  QCborStreamReaderPrivate *unaff_retaddr;
  CborError err;
  CborError err_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  Code CVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CVar4 = NoError;
  pQVar3 = std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
           ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                         *)0x8d61c5);
  (pQVar3->lastError).c = CVar4;
  std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
  operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_> *
             )0x8d61d9);
  QCborStreamReaderPrivate::preread(unaff_retaddr);
  std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
  operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_> *
             )0x8d61ee);
  CVar2 = cbor_value_reparse(in_RDI);
  err_00 = (CborError)((ulong)in_RDI >> 0x20);
  if (CVar2 == CborNoError) {
    preparse((QCborStreamReader *)CONCAT44(CVar4,in_stack_fffffffffffffff0));
  }
  else {
    std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
    operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                *)0x8d6212);
    QCborStreamReaderPrivate::handleError
              ((QCborStreamReaderPrivate *)CONCAT44(CVar2,in_stack_ffffffffffffffe0),err_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamReader::reparse()
{
    d->lastError = {};
    d->preread();
    if (CborError err = cbor_value_reparse(&d->currentElement))
        d->handleError(err);
    else
        preparse();
}